

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarManInitialize(Ssw_RarMan_t *p,Vec_Int_t *vInit)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  word *pwVar4;
  Aig_Obj_t *pObj_00;
  word *pwVar5;
  word wVar6;
  int local_40;
  int local_3c;
  int i;
  int w;
  word *pSimLi;
  word *pSim;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Int_t *vInit_local;
  Ssw_RarMan_t *p_local;
  
  pAVar3 = Aig_ManConst1(p->pAig);
  iVar1 = Aig_ObjId(pAVar3);
  pwVar4 = Ssw_RarObjSim(p,iVar1);
  for (local_3c = 0; local_3c < p->pPars->nWords; local_3c = local_3c + 1) {
    pwVar4[local_3c] = 0xffffffffffffffff;
  }
  Ssw_RarManAssingRandomPis(p);
  if (vInit == (Vec_Int_t *)0x0) {
    for (local_40 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_40 < iVar1; local_40 = local_40 + 1) {
      pAVar3 = Saig_ManLi(p->pAig,local_40);
      pObj_00 = Saig_ManLo(p->pAig,local_40);
      iVar1 = Aig_ObjId(pAVar3);
      pwVar4 = Ssw_RarObjSim(p,iVar1);
      iVar1 = Aig_ObjId(pObj_00);
      pwVar5 = Ssw_RarObjSim(p,iVar1);
      for (local_3c = 0; local_3c < p->pPars->nWords; local_3c = local_3c + 1) {
        pwVar5[local_3c] = pwVar4[local_3c];
      }
    }
  }
  else {
    iVar1 = Vec_IntSize(vInit);
    iVar2 = Saig_ManRegNum(p->pAig);
    if (iVar1 != iVar2 * p->pPars->nWords) {
      __assert_fail("Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x1ae,"void Ssw_RarManInitialize(Ssw_RarMan_t *, Vec_Int_t *)");
    }
    for (local_40 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_40 < iVar1; local_40 = local_40 + 1) {
      p_00 = p->pAig->vCis;
      iVar1 = Saig_ManPiNum(p->pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_40 + iVar1);
      iVar1 = Aig_ObjId(pAVar3);
      pwVar4 = Ssw_RarObjSim(p,iVar1);
      for (local_3c = 0; local_3c < p->pPars->nWords; local_3c = local_3c + 1) {
        iVar1 = Saig_ManRegNum(p->pAig);
        iVar1 = Vec_IntEntry(vInit,local_3c * iVar1 + local_40);
        wVar6 = 0;
        if (iVar1 != 0) {
          wVar6 = 0xffffffffffffffff;
        }
        pwVar4[local_3c] = wVar6;
      }
    }
  }
  return;
}

Assistant:

void Ssw_RarManInitialize( Ssw_RarMan_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj, * pObjLi;
    word * pSim, * pSimLi;
    int w, i;
    // constant
    pObj = Aig_ManConst1( p->pAig );
    pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    for ( w = 0; w < p->pPars->nWords; w++ )
        pSim[w] = ~(word)0;
    // primary inputs
    Ssw_RarManAssingRandomPis( p );
    // flop outputs
    if ( vInit )
    {
        assert( Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords );
        Saig_ManForEachLo( p->pAig, pObj, i )
        {
            pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = Vec_IntEntry(vInit, w * Saig_ManRegNum(p->pAig) + i) ? ~(word)0 : (word)0;
        }
    }
    else
    {
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
        {
            pSimLi = Ssw_RarObjSim( p, Aig_ObjId(pObjLi) );
            pSim   = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = pSimLi[w];
        }
    }
}